

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptrcircularlist.h
# Opt level: O0

void __thiscall
cookmem::
CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
::add(CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
      *this,SmallMemChunk *ptr)

{
  SmallMemChunk *pSVar1;
  SmallMemChunk *pSVar2;
  SmallMemChunk *next;
  SmallMemChunk *curr;
  SmallMemChunk *ptr_local;
  CircularList<cookmem::MemPool<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>::SmallMemChunk>
  *this_local;
  
  if (this->m_head == (SmallMemChunk *)0x0) {
    ptr->next = ptr;
    ptr->prev = ptr;
    this->m_head = ptr;
  }
  else {
    pSVar1 = this->m_head;
    pSVar2 = this->m_head->next;
    pSVar1->next = ptr;
    pSVar2->prev = ptr;
    ptr->next = pSVar2;
    ptr->prev = pSVar1;
  }
  return;
}

Assistant:

void
    add (Node* ptr)
    {
        if (m_head)
        {
            Node* curr = m_head;
            Node* next = m_head->next;
            curr->next = ptr;
            next->prev = ptr;
            ptr->next = next;
            ptr->prev = curr;
        }
        else
        {
            ptr->next = ptr;
            ptr->prev = ptr;
            m_head = ptr;
        }
    }